

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Dumper::appendDouble(Dumper *this,double v)

{
  int iVar1;
  longdouble in_ST0;
  longdouble in_ST1;
  char temp [24];
  char local_28 [24];
  
  ldexpl(0x35);
  if (in_ST0 <= (longdouble)ABS(v)) {
    ldexpl(0x40);
    if ((longdouble)ABS(v) < in_ST1) {
      if (v < 0.0) {
        v = -v;
        (*this->_sink->_vptr_Sink[3])(this->_sink,"-",1);
      }
      appendUInt(this,(long)(v - 9.223372036854776e+18) & (long)v >> 0x3f | (long)v);
      (*this->_sink->_vptr_Sink[3])(this->_sink,".0",2);
      return;
    }
  }
  iVar1 = fpconv_dtoa(v,local_28);
  (*this->_sink->_vptr_Sink[3])(this->_sink,local_28,(long)iVar1);
  return;
}

Assistant:

void Dumper::appendDouble(double v) {
  char temp[24];
  double a = fabs(v);
  if (a >= ldexpl(1.0, 53) && a < ldexpl(1.0, 64)) {
    // This is a special case which we want to handle separately, because
    // of two reasons:
    //  (1) The function fpconv_dtoa below only guarantees to write a
    //      decimal representation which gives the same double value when
    //      parsed back into a double. It can write a wrong integer.
    //      Therefore we want to use the integer code in this case.
    //  (2) The function fpconv_dtoa will write a normal integer
    //      representation in this case without a decimal point. If we
    //      parse this back to vpack later, we end up in a different
    //      representation (uint64_t or int64_t), so we want to append
    //      ".0" to the string in this case.
    // Note that this automatically excludes all infinities and NaNs,
    // which will be handled in the function fpconv_dtoa below.
    uint64_t u;
    if (v < 0) {
      u = static_cast<uint64_t>(-v);
      _sink->append("-", 1);
    } else {
      u = static_cast<uint64_t>(v);
    }
    appendUInt(u);
    _sink->append(".0", 2);
    return;
  }
  int len = fpconv_dtoa(v, &temp[0]);
  _sink->append(&temp[0], static_cast<ValueLength>(len));
}